

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::processConfigUpdateMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  action_t aVar1;
  bool bVar2;
  int iVar3;
  Time propertyVal;
  
  aVar1 = cmd->messageAction;
  if (aVar1 != cmd_fed_configure_flag) {
    if (aVar1 == cmd_fed_configure_int) {
      iVar3 = cmd->messageID;
      if (iVar3 == 0x103) {
        (this->info).maxIterations = (uint)cmd->counter;
        return;
      }
      propertyVal.internalTimeCode = (baseType)((double)cmd->counter * 1000000000.0 + 0.5);
    }
    else {
      if (aVar1 != cmd_fed_configure_time) {
        return;
      }
      iVar3 = cmd->messageID;
      propertyVal.internalTimeCode = (cmd->actionTime).internalTimeCode;
    }
    setProperty(this,iVar3,propertyVal);
    return;
  }
  iVar3 = cmd->messageID;
  bVar2 = (bool)((byte)cmd->flags >> 5 & 1);
  if (iVar3 < 0xb) {
    if (iVar3 == 1) {
      (this->info).uninterruptible = bVar2;
      return;
    }
    if (iVar3 == 10) {
      (this->info).wait_for_current_time_updates = bVar2;
      return;
    }
  }
  else if (iVar3 == 0xb) {
    (this->info).restrictive_time_policy = bVar2;
  }
  else if (iVar3 == 0x51) {
    (this->info).event_triggered = bVar2;
    return;
  }
  return;
}

Assistant:

action_message_def::action_t action() const noexcept { return messageAction; }